

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void __thiscall
vera::dynamicCubemap
          (vera *this,
          function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
          *_renderFnc,vec3 _pos,int _viewSize)

{
  undefined4 in_register_00000014;
  int _width;
  vec3 vVar1;
  vec<3,_float,_(glm::qualifier)0> vVar2;
  vec4 vVar3;
  undefined8 local_314;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_30c;
  vec3 local_308;
  vec<3,_float,_(glm::qualifier)0> local_2f8;
  vec<3,_float,_(glm::qualifier)0> local_2e8;
  vec3 local_2d8;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_2c8;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_2c4;
  vec4 vp;
  int _side;
  undefined1 local_2a8 [8];
  Camera cubemapCam;
  GLint viewport [4];
  int _viewSize_local;
  function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *_renderFnc_local;
  undefined1 local_18 [8];
  vec3 _pos_local;
  
  _pos_local.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)_pos.field_2;
  local_18 = _pos._0_8_;
  _width = (int)_renderFnc;
  glGetIntegerv(0xba2,&cubemapCam.m_projectionType,CONCAT44(in_register_00000014,_viewSize));
  Camera::Camera((Camera *)local_2a8);
  Node::setPosition((Node *)local_2a8,(vec3 *)local_18);
  Camera::setFOV((Camera *)local_2a8,90.0);
  Camera::setViewport((Camera *)local_2a8,_width,_width);
  for (vp.field_2.z = 0.0; (int)vp.field_2 < 6; vp.field_2.z = vp.field_2.z + 1) {
    vVar3 = getFaceViewport(_width,(int)vp.field_2);
    vp._0_8_ = vVar3._8_8_;
    _local_2c8 = vVar3._0_8_;
    vVar1 = CubemapFace<float>::getFaceDirection((long)(int)vp.field_2);
    local_2f8.field_2 = vVar1.field_2;
    local_2f8._0_8_ = vVar1._0_8_;
    local_2e8._0_8_ = local_2f8._0_8_;
    local_2e8.field_2 = local_2f8.field_2;
    vVar2 = glm::operator*(&local_2e8,-10.0);
    local_308.field_2 = vVar2.field_2;
    local_308._0_8_ = vVar2._0_8_;
    local_2d8._0_8_ = local_308._0_8_;
    local_2d8.field_2 = local_308.field_2;
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_314,0.0,1.0,0.0);
    vVar1.field_2 = local_30c;
    vVar1.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_314;
    vVar1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_314._4_4_;
    Node::lookAt((Node *)local_2a8,&local_2d8,vVar1);
    glViewport((int)local_2c8.x,(int)aStack_2c4.y,(int)vp.field_0.x,(int)vp.field_1.y);
    glEnable(0xc11);
    glScissor((int)local_2c8.x,(int)aStack_2c4.y,(int)vp.field_0.x,(int)vp.field_1.y);
    std::function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>::operator()
              ((function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *)
               this,(Camera *)local_2a8,(vec<4,_float,_(glm::qualifier)0> *)&local_2c8,
               (int *)&vp.field_2);
  }
  glViewport(cubemapCam.m_projectionType,cubemapCam._604_4_,viewport[0],viewport[1]);
  glDisable(0xc11);
  glScissor(cubemapCam.m_projectionType,cubemapCam._604_4_,viewport[0],viewport[1]);
  Camera::~Camera((Camera *)local_2a8);
  return;
}

Assistant:

void dynamicCubemap(std::function<void(Camera&, glm::vec4&, int&)> _renderFnc, glm::vec3 _pos, int _viewSize) {

    // save the viewport for the total quilt
    GLint viewport[4];
    glGetIntegerv(GL_VIEWPORT, viewport);

    Camera  cubemapCam;
    cubemapCam.setPosition(_pos);
    cubemapCam.setFOV(90.0);
    cubemapCam.setViewport(_viewSize, _viewSize);

    // render views and copy each view to the quilt
    for (int _side = 0; _side < 6; _side++) {
        glm::vec4 vp = getFaceViewport(_viewSize, _side);
        cubemapCam.lookAt( CubemapFace<float>::getFaceDirection(_side) * -10.0f );

        glViewport(vp.x, vp.y, vp.z, vp.w);

        glEnable(GL_SCISSOR_TEST);
        glScissor(vp.x, vp.y, vp.z, vp.w);

        _renderFnc(cubemapCam, vp, _side);
    }

    // reset viewport
    glViewport(viewport[0], viewport[1], viewport[2], viewport[3]);

    // // restore scissor
    glDisable(GL_SCISSOR_TEST);
    glScissor(viewport[0], viewport[1], viewport[2], viewport[3]);


}